

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChFrameMoving<double> * __thiscall
chrono::ChFrameMoving<double>::operator=(ChFrameMoving<double> *this,ChFrame<double> *other)

{
  ChQuaternion<double> *other_00;
  
  if ((ChFrameMoving<double> *)other != this) {
    ChFrame<double>::operator=(&this->super_ChFrame<double>,other);
    other_00 = ChQuaternion<double>::operator=
                         (&(this->coord_dtdt).rot,(ChQuaternion<double> *)QNULL);
    ChQuaternion<double>::operator=(&(this->coord_dt).rot,other_00);
  }
  return this;
}

Assistant:

ChFrameMoving<Real>& operator=(const ChFrame<Real>& other) {
        if (&other == this)
            return *this;
        ChFrame<Real>::operator=(other);
        coord_dt.rot = coord_dtdt.rot = QNULL;
        return *this;
    }